

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O0

void ptrobj_equal(t_ptrobj *x,t_gpointer *gp)

{
  int iVar1;
  t_symbol *ptVar2;
  bool bVar3;
  t_typedout *local_38;
  t_typedout *to;
  int result;
  int which;
  int n;
  t_symbol *templatesym;
  t_gpointer *gp_local;
  t_ptrobj *x_local;
  
  iVar1 = gpointer_check(&x->x_gp,1);
  if (iVar1 == 0) {
    pd_error(x,"pointer equal: empty pointer");
  }
  else {
    bVar3 = false;
    if ((gp->gp_stub->gs_un).gs_glist == (((x->x_gp).gp_stub)->gs_un).gs_glist) {
      bVar3 = (gp->gp_un).gp_scalar == (x->x_gp).gp_un.gp_scalar;
    }
    if (bVar3) {
      ptVar2 = gpointer_gettemplatesym(&x->x_gp);
      local_38 = x->x_typedout;
      result = x->x_ntypedout;
      while (result != 0) {
        if (local_38->to_type == ptVar2) {
          outlet_pointer(local_38->to_outlet,&x->x_gp);
          return;
        }
        local_38 = local_38 + 1;
        result = result + -1;
      }
      outlet_pointer(x->x_otherout,&x->x_gp);
    }
    else {
      outlet_bang(x->x_bangout);
    }
  }
  return;
}

Assistant:

static void ptrobj_equal(t_ptrobj *x, t_gpointer *gp)
{
    t_symbol *templatesym;
    int n, which, result;
    t_typedout *to;
    if (!gpointer_check(&x->x_gp, 1))
    {
        pd_error(x, "pointer equal: empty pointer");
        return;
    }
    /* we don't care for the actual type in the union because they are all pointers */
    result = (gp->gp_stub->gs_un.gs_glist == x->x_gp.gp_stub->gs_un.gs_glist) &&
        (gp->gp_un.gp_scalar == x->x_gp.gp_un.gp_scalar);
    if (!result)
    {
        outlet_bang(x->x_bangout);
        return;
    }
    templatesym = gpointer_gettemplatesym(&x->x_gp);
    for (n = x->x_ntypedout, to = x->x_typedout; n--; to++)
    {
        if (to->to_type == templatesym)
        {
            outlet_pointer(to->to_outlet, &x->x_gp);
            return;
        }
    }
    outlet_pointer(x->x_otherout, &x->x_gp);
}